

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

double __thiscall Mat::NormInf(Mat *this)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = ABS(*this->v_);
  uVar1 = this->n_cols_ * this->n_rows_;
  if (1 < (int)uVar1) {
    uVar2 = 1;
    do {
      dVar3 = ABS(this->v_[uVar2]);
      if (dVar3 <= dVar4) {
        dVar3 = dVar4;
      }
      uVar2 = uVar2 + 1;
      dVar4 = dVar3;
    } while (uVar1 != uVar2);
    return dVar3;
  }
  return dVar4;
}

Assistant:

double Mat::NormInf()
{	
	double output = abs(v_[0]);	
	for (int i = 1; i < Size(); i++)
		output = output<abs(v_[i]) ? output=abs (v_[i]):output;
	return output;
}